

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::computeGradient(MultiFab *grad,Array<const_MultiFab_*,_3> *umac,Geometry *geom)

{
  Box tbx;
  Box local_1c4;
  GpuArray<double,_3U> local_1a8;
  MFIter mfi;
  Array4<const_double> local_130;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<double> local_70;
  
  local_1a8.arr[0] = (geom->super_CoordSys).inv_dx[0];
  local_1a8.arr[1] = (geom->super_CoordSys).inv_dx[1];
  local_1a8.arr[2] = (geom->super_CoordSys).inv_dx[2];
  MFIter::MFIter(&mfi,(FabArrayBase *)grad,true);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_1c4,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_70,&grad->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_b0,&umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_f0,&umac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_130,&umac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
    tbx.bigend.vect[2] = local_1c4.bigend.vect[2];
    tbx.btype.itype = local_1c4.btype.itype;
    tbx.smallend.vect[0] = local_1c4.smallend.vect[0];
    tbx.smallend.vect[1] = local_1c4.smallend.vect[1];
    amrex_compute_gradient(&tbx,&local_70,&local_b0,&local_f0,&local_130,&local_1a8);
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void computeGradient (MultiFab& grad,  const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                          const Geometry& geom)
    {
        AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

#if (AMREX_SPACEDIM==2)
        const auto& ba = grad.boxArray();
        const auto& dm = grad.DistributionMap();
        MultiFab volume, areax, areay;
        if (geom.IsRZ()) {
            geom.GetVolume(volume, ba, dm, 0);
            geom.GetFaceArea(areax, ba, dm, 0, 0);
            geom.GetFaceArea(areay, ba, dm, 1, 0);
        }
#endif

        const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(grad,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& gradfab = grad.array(mfi);
            AMREX_D_TERM(const auto& ufab = umac[0]->const_array(mfi);,
                         const auto& vfab = umac[1]->const_array(mfi);,
                         const auto& wfab = umac[2]->const_array(mfi););
#if (AMREX_SPACEDIM==2)
            if (geom.IsRZ()) {
                Array4<Real const> const&  ax =  areax.array(mfi);
                Array4<Real const> const&  ay =  areay.array(mfi);
                Array4<Real const> const& vol = volume.array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_gradient_rz(tbx,gradfab,AMREX_D_DECL(ufab,vfab,wfab),ax,ay,vol);
                });
            } else
#endif
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_gradient(tbx,gradfab,AMREX_D_DECL(ufab,vfab,wfab),dxinv);
                });
            }
        }
    }